

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O3

uint32_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hash32
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint32_t seed)

{
  XXH32_hash_t XVar1;
  size_t len;
  byte *start;
  
  start = *(byte **)this;
  len = (size_t)"\x01\x01"[*start];
  if (len == 0) {
    len = byteSizeDynamic(this,start);
    start = *(byte **)this;
  }
  XVar1 = VELOCYPACK_XXH32(start,len,seed);
  return XVar1;
}

Assistant:

inline uint32_t hash32(uint32_t seed = defaultSeed32) const {
    size_t const size = checkOverflow(byteSize());
    return VELOCYPACK_HASH32(start(), size, seed);
  }